

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::addSemaphoreInfo(CLIntercept *this,cl_semaphore_khr semaphore,cl_context context)

{
  mutex *__mutex;
  int iVar1;
  cl_platform_id p_Var2;
  mapped_type *pp_Var3;
  undefined8 uVar4;
  cl_semaphore_khr local_20;
  
  if (semaphore != (cl_semaphore_khr)0x0) {
    __mutex = &this->m_Mutex;
    local_20 = semaphore;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 != 0) {
      uVar4 = std::__throw_system_error(iVar1);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar4);
    }
    p_Var2 = getPlatform(this,context);
    pp_Var3 = std::
              map<_cl_semaphore_khr_*,__cl_platform_id_*,_std::less<_cl_semaphore_khr_*>,_std::allocator<std::pair<_cl_semaphore_khr_*const,__cl_platform_id_*>_>_>
              ::operator[](&this->m_SemaphoreInfoMap,&local_20);
    *pp_Var3 = p_Var2;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return;
}

Assistant:

void CLIntercept::addSemaphoreInfo(
    cl_semaphore_khr semaphore,
    cl_context context )
{
    if( semaphore )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        m_SemaphoreInfoMap[semaphore] = getPlatform(context);
    }
}